

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

Symbol * slang::ast::anon_unknown_39::unwrapTypeParam(Scope *scope,Symbol *symbol)

{
  Type *pTVar1;
  
  if (symbol->kind == TypeParameter) {
    Compilation::noteReference((Compilation *)scope,symbol,false);
    symbol = &DeclaredType::getType((DeclaredType *)&symbol[1].location)->super_Symbol;
    pTVar1 = ((Type *)symbol)->canonical;
    if (pTVar1 == (Type *)0x0) {
      Type::resolveCanonical((Type *)symbol);
      pTVar1 = ((Type *)symbol)->canonical;
    }
    if ((pTVar1->super_Symbol).kind == ErrorType) {
      symbol = (Symbol *)0x0;
    }
  }
  return &((Type *)symbol)->super_Symbol;
}

Assistant:

const Symbol* unwrapTypeParam(const Scope& scope, const Symbol* symbol) {
    if (symbol->kind == SymbolKind::TypeParameter) {
        scope.getCompilation().noteReference(*symbol);

        auto result = &symbol->as<TypeParameterSymbol>().targetType.getType();
        if (result->isError())
            return nullptr;

        return result;
    }
    return symbol;
}